

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

int voc_check_special(voccxdef *ctx,char *wrd,int checktyp)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  vocspdef *x;
  vocspdef *pvVar6;
  
  pcVar4 = ctx->voccxspp;
  if (pcVar4 == (char *)0x0) {
    for (pvVar6 = vocsptab; pvVar6->vocspin != (char *)0x0; pvVar6 = pvVar6 + 1) {
      if ((pvVar6->vocspout == 'O') && (iVar2 = strncmp(wrd,pvVar6->vocspin,6), iVar2 == 0)) {
        return 1;
      }
    }
  }
  else {
    sVar3 = strlen(wrd);
    pcVar5 = pcVar4 + ctx->voccxspl;
    for (; pcVar4 < pcVar5; pcVar4 = pcVar4 + 2 + cVar1) {
      cVar1 = pcVar4[1];
      if (((int)cVar1 == (int)sVar3 && *pcVar4 == 'O') &&
         (iVar2 = bcmp(pcVar4 + 2,wrd,(long)cVar1), iVar2 == 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int voc_check_special(voccxdef *ctx, char *wrd, int checktyp)
{
    /* search the user or built-in special table, as appropriate */
    if (ctx->voccxspp)
    {
        char  *p;
        char  *endp;
        char   typ;
        int    len;
        int    wrdlen = strlen((char *)wrd);
        
        for (p = ctx->voccxspp, endp = p + ctx->voccxspl ;
             p < endp ; )
        {
            typ = *p++;
            len = *p++;

            /* if this word matches in type and text, we have a match */
            if (typ == checktyp
                && len == wrdlen && !memcmp(p, wrd, (size_t)len))
                return TRUE;

            /* no match - keep going */
            p += len;
        }
    }
    else
    {
        vocspdef *x;
        
        for (x = vocsptab ; x->vocspin ; ++x)
        {
            /* if it matches in type and text, we have a match */
            if (x->vocspout == checktyp
                && !strncmp((char *)wrd, x->vocspin, (size_t)6))
                return TRUE;
        }
    }

    /* didn't find a match for the text and type */
    return FALSE;
}